

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

bool __thiscall
google::protobuf::TextFormat::Parser::Parse(Parser *this,ZeroCopyInputStream *input,Message *output)

{
  bool bVar1;
  Descriptor *root_message_type;
  Metadata MVar2;
  ParserImpl parser;
  
  (*(output->super_MessageLite)._vptr_MessageLite[2])(output);
  bVar1 = this->allow_singular_overwrites_;
  MVar2 = Message::GetMetadata(output);
  root_message_type = MVar2.descriptor;
  ParserImpl::ParserImpl
            (&parser,root_message_type,input,this->error_collector_,this->finder_,
             this->parse_info_tree_,bVar1 ^ FORBID_SINGULAR_OVERWRITES,
             this->allow_case_insensitive_field_,this->allow_unknown_field_,
             this->allow_unknown_extension_,this->allow_unknown_enum_,this->allow_field_number_,
             this->allow_relaxed_whitespace_,this->allow_partial_,this->recursion_limit_,
             this->no_op_fields_);
  bVar1 = MergeUsingImpl(this,(ZeroCopyInputStream *)root_message_type,output,&parser);
  io::Tokenizer::~Tokenizer(&parser.tokenizer_);
  io::ErrorCollector::~ErrorCollector(&parser.tokenizer_error_collector_.super_ErrorCollector);
  return bVar1;
}

Assistant:

bool TextFormat::Parser::Parse(io::ZeroCopyInputStream* input,
                               Message* output) {
  output->Clear();

  ParserImpl::SingularOverwritePolicy overwrites_policy =
      allow_singular_overwrites_ ? ParserImpl::ALLOW_SINGULAR_OVERWRITES
                                 : ParserImpl::FORBID_SINGULAR_OVERWRITES;

  ParserImpl parser(output->GetDescriptor(), input, error_collector_, finder_,
                    parse_info_tree_, overwrites_policy,
                    allow_case_insensitive_field_, allow_unknown_field_,
                    allow_unknown_extension_, allow_unknown_enum_,
                    allow_field_number_, allow_relaxed_whitespace_,
                    allow_partial_, recursion_limit_, no_op_fields_);
  return MergeUsingImpl(input, output, &parser);
}